

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator * __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::iterator::operator++(iterator *this)

{
  ctrl_t cVar1;
  ctrl_t *pcVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [11];
  undefined1 auVar11 [12];
  undefined1 auVar12 [13];
  undefined1 auVar13 [14];
  slot_type *psVar14;
  uint uVar15;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  
  pcVar2 = this->ctrl_;
  if (pcVar2 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::iterator::operator++((iterator *)this);
LAB_001dca0a:
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::iterator::operator++((iterator *)this);
  }
  else {
    if (pcVar2 == kEmptyGroup + 0x10) goto LAB_001dca0a;
    if (kSentinel < *pcVar2) {
      this->ctrl_ = pcVar2 + 1;
      psVar14 = (this->field_1).slot_ + 1;
      (this->field_1).slot_ = psVar14;
      cVar1 = pcVar2[1];
      pcVar2 = pcVar2 + 1;
      while (cVar1 < kSentinel) {
        iVar6 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                       CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
        iVar7 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                       CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
        iVar8 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                       CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
        iVar9 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                       CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
        in_XMM1_Ba = -(*pcVar2 < (ctrl_t)iVar6);
        in_XMM1_Bb = -(pcVar2[1] < (ctrl_t)((uint)iVar6 >> 8));
        in_XMM1_Bc = -(pcVar2[2] < (ctrl_t)((uint)iVar6 >> 0x10));
        in_XMM1_Bd = -(pcVar2[3] < (ctrl_t)((uint)iVar6 >> 0x18));
        in_XMM1_Be = -(pcVar2[4] < (ctrl_t)iVar7);
        in_XMM1_Bf = -(pcVar2[5] < (ctrl_t)((uint)iVar7 >> 8));
        in_XMM1_Bg = -(pcVar2[6] < (ctrl_t)((uint)iVar7 >> 0x10));
        in_XMM1_Bh = -(pcVar2[7] < (ctrl_t)((uint)iVar7 >> 0x18));
        in_XMM1_Bi = -(pcVar2[8] < (ctrl_t)iVar8);
        in_XMM1_Bj = -(pcVar2[9] < (ctrl_t)((uint)iVar8 >> 8));
        in_XMM1_Bk = -(pcVar2[10] < (ctrl_t)((uint)iVar8 >> 0x10));
        in_XMM1_Bl = -(pcVar2[0xb] < (ctrl_t)((uint)iVar8 >> 0x18));
        in_XMM1_Bm = -(pcVar2[0xc] < (ctrl_t)iVar9);
        in_XMM1_Bn = -(pcVar2[0xd] < (ctrl_t)((uint)iVar9 >> 8));
        in_XMM1_Bo = -(pcVar2[0xe] < (ctrl_t)((uint)iVar9 >> 0x10));
        in_XMM1_Bp = -(pcVar2[0xf] < (ctrl_t)((uint)iVar9 >> 0x18));
        auVar4[1] = in_XMM1_Bb;
        auVar4[0] = in_XMM1_Ba;
        auVar4[2] = in_XMM1_Bc;
        auVar4[3] = in_XMM1_Bd;
        auVar4[4] = in_XMM1_Be;
        auVar4[5] = in_XMM1_Bf;
        auVar4[6] = in_XMM1_Bg;
        auVar4[7] = in_XMM1_Bh;
        auVar4[8] = in_XMM1_Bi;
        auVar4[9] = in_XMM1_Bj;
        auVar4[10] = in_XMM1_Bk;
        auVar4[0xb] = in_XMM1_Bl;
        auVar4[0xc] = in_XMM1_Bm;
        auVar4[0xd] = in_XMM1_Bn;
        auVar4[0xe] = in_XMM1_Bo;
        auVar4[0xf] = in_XMM1_Bp;
        auVar5[1] = in_XMM1_Bb;
        auVar5[0] = in_XMM1_Ba;
        auVar5[2] = in_XMM1_Bc;
        auVar5[3] = in_XMM1_Bd;
        auVar5[4] = in_XMM1_Be;
        auVar5[5] = in_XMM1_Bf;
        auVar5[6] = in_XMM1_Bg;
        auVar5[7] = in_XMM1_Bh;
        auVar5[8] = in_XMM1_Bi;
        auVar5[9] = in_XMM1_Bj;
        auVar5[10] = in_XMM1_Bk;
        auVar5[0xb] = in_XMM1_Bl;
        auVar5[0xc] = in_XMM1_Bm;
        auVar5[0xd] = in_XMM1_Bn;
        auVar5[0xe] = in_XMM1_Bo;
        auVar5[0xf] = in_XMM1_Bp;
        auVar13[1] = in_XMM1_Bd;
        auVar13[0] = in_XMM1_Bc;
        auVar13[2] = in_XMM1_Be;
        auVar13[3] = in_XMM1_Bf;
        auVar13[4] = in_XMM1_Bg;
        auVar13[5] = in_XMM1_Bh;
        auVar13[6] = in_XMM1_Bi;
        auVar13[7] = in_XMM1_Bj;
        auVar13[8] = in_XMM1_Bk;
        auVar13[9] = in_XMM1_Bl;
        auVar13[10] = in_XMM1_Bm;
        auVar13[0xb] = in_XMM1_Bn;
        auVar13[0xc] = in_XMM1_Bo;
        auVar13[0xd] = in_XMM1_Bp;
        auVar12[1] = in_XMM1_Be;
        auVar12[0] = in_XMM1_Bd;
        auVar12[2] = in_XMM1_Bf;
        auVar12[3] = in_XMM1_Bg;
        auVar12[4] = in_XMM1_Bh;
        auVar12[5] = in_XMM1_Bi;
        auVar12[6] = in_XMM1_Bj;
        auVar12[7] = in_XMM1_Bk;
        auVar12[8] = in_XMM1_Bl;
        auVar12[9] = in_XMM1_Bm;
        auVar12[10] = in_XMM1_Bn;
        auVar12[0xb] = in_XMM1_Bo;
        auVar12[0xc] = in_XMM1_Bp;
        auVar11[1] = in_XMM1_Bf;
        auVar11[0] = in_XMM1_Be;
        auVar11[2] = in_XMM1_Bg;
        auVar11[3] = in_XMM1_Bh;
        auVar11[4] = in_XMM1_Bi;
        auVar11[5] = in_XMM1_Bj;
        auVar11[6] = in_XMM1_Bk;
        auVar11[7] = in_XMM1_Bl;
        auVar11[8] = in_XMM1_Bm;
        auVar11[9] = in_XMM1_Bn;
        auVar11[10] = in_XMM1_Bo;
        auVar11[0xb] = in_XMM1_Bp;
        auVar10[1] = in_XMM1_Bg;
        auVar10[0] = in_XMM1_Bf;
        auVar10[2] = in_XMM1_Bh;
        auVar10[3] = in_XMM1_Bi;
        auVar10[4] = in_XMM1_Bj;
        auVar10[5] = in_XMM1_Bk;
        auVar10[6] = in_XMM1_Bl;
        auVar10[7] = in_XMM1_Bm;
        auVar10[8] = in_XMM1_Bn;
        auVar10[9] = in_XMM1_Bo;
        auVar10[10] = in_XMM1_Bp;
        uVar15 = (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar13 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar12 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar11 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar10 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar3 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        this->ctrl_ = pcVar2 + uVar3;
        psVar14 = (slot_type *)((long)psVar14 + (ulong)(uVar3 << 6));
        (this->field_1).slot_ = psVar14;
        cVar1 = pcVar2[uVar3];
        pcVar2 = pcVar2 + uVar3;
      }
      if (*this->ctrl_ != kSentinel) {
        return this;
      }
      goto LAB_001dca14;
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::iterator::operator++((iterator *)this);
LAB_001dca14:
  this->ctrl_ = (ctrl_t *)0x0;
  return this;
}

Assistant:

iterator& operator++() {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator++");
      ++ctrl_;
      ++slot_;
      skip_empty_or_deleted();
      if (ABSL_PREDICT_FALSE(*ctrl_ == ctrl_t::kSentinel)) ctrl_ = nullptr;
      return *this;
    }